

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intmod_k(jit_State *J)

{
  uint uVar1;
  TRef TVar2;
  int32_t k;
  jit_State *J_local;
  
  uVar1 = (J->fold).right[0].i;
  if (((int)uVar1 < 1) || ((uVar1 & uVar1 - 1) != 0)) {
    J_local._4_4_ = 0;
  }
  else {
    (J->fold).ins.field_1.o = '!';
    TVar2 = lj_ir_kint(J,uVar1 - 1);
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    J_local._4_4_ = 1;
  }
  return J_local._4_4_;
}

Assistant:

LJFOLD(MOD any KINT)
LJFOLDF(simplify_intmod_k)
{
  int32_t k = fright->i;
  lj_assertJ(k != 0, "integer mod 0");
  if (k > 0 && (k & (k-1)) == 0) {  /* i % (2^k) ==> i & (2^k-1) */
    fins->o = IR_BAND;
    fins->op2 = lj_ir_kint(J, k-1);
    return RETRYFOLD;
  }
  return NEXTFOLD;
}